

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes2CapabilityTests.cpp
# Opt level: O2

int __thiscall deqp::gles2::ExtensionTests::init(ExtensionTests *this,EVP_PKEY_CTX *ctx)

{
  ExtGroup *pEVar1;
  ExtGroup local_20;
  
  init()::ExtGroup::ExtGroup(deqp::gles2::TestCaseGroup__char_const__char_const__
            (&local_20,&this->super_TestCaseGroup,"uncompressed_texture_formats",
             "Uncompressed texture formats");
  pEVar1 = init::ExtGroup::operator<<(&local_20,"GL_OES_texture_float_linear");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_OES_texture_half_float_linear");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_OES_texture_float");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_OES_texture_half_float");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_OES_texture_npot");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_EXT_texture_format_BGRA8888");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_EXT_texture_rg");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_EXT_texture_type_2_10_10_10_REV");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_EXT_sRGB");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_APPLE_rgb_422");
  init::ExtGroup::operator<<(pEVar1,"GL_APPLE_texture_format_BGRA8888");
  init()::ExtGroup::ExtGroup(deqp::gles2::TestCaseGroup__char_const__char_const__
            (&local_20,&this->super_TestCaseGroup,"compressed_texture_formats",
             "Compressed texture formats");
  pEVar1 = init::ExtGroup::operator<<(&local_20,"GL_OES_compressed_ETC1_RGB8_texture");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_OES_compressed_paletted_texture");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_EXT_texture_compression_dxt1");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_AMD_compressed_3DC_texture");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_AMD_compressed_ATC_texture");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_IMG_texture_compression_pvrtc");
  init::ExtGroup::operator<<(pEVar1,"GL_NV_texture_compression_s3tc_update");
  init()::ExtGroup::ExtGroup(deqp::gles2::TestCaseGroup__char_const__char_const__
            (&local_20,&this->super_TestCaseGroup,"texture","Texturing features");
  pEVar1 = init::ExtGroup::operator<<(&local_20,"GL_OES_texture_3D");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_OES_depth_texture");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_EXT_texture_filter_anisotropic");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_EXT_texture_lod_bias");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_EXT_shadow_samplers");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_EXT_texture_storage");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_NV_texture_npot_2D_mipmap");
  init::ExtGroup::operator<<(pEVar1,"GL_APPLE_texture_max_level");
  init()::ExtGroup::ExtGroup(deqp::gles2::TestCaseGroup__char_const__char_const__
            (&local_20,&this->super_TestCaseGroup,"fbo","FBO features");
  pEVar1 = init::ExtGroup::operator<<(&local_20,"GL_OES_depth24");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_OES_depth32");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_OES_packed_depth_stencil");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_OES_fbo_render_mipmap");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_OES_rgb8_rgba8");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_OES_stencil1");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_OES_stencil4");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_OES_stencil8");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_EXT_color_buffer_half_float");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_EXT_multisampled_render_to_texture");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_IMG_multisampled_render_to_texture");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_ARM_rgba8");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_NV_depth_nonlinear");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_NV_draw_buffers");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_NV_fbo_color_attachments");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_NV_read_buffer");
  init::ExtGroup::operator<<(pEVar1,"GL_APPLE_framebuffer_multisample");
  init()::ExtGroup::ExtGroup(deqp::gles2::TestCaseGroup__char_const__char_const__
            (&local_20,&this->super_TestCaseGroup,"vertex_data_formats","Vertex data formats");
  pEVar1 = init::ExtGroup::operator<<(&local_20,"GL_OES_element_index_uint");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_OES_vertex_half_float");
  init::ExtGroup::operator<<(pEVar1,"GL_OES_vertex_type_10_10_10_2");
  init()::ExtGroup::ExtGroup(deqp::gles2::TestCaseGroup__char_const__char_const__
            (&local_20,&this->super_TestCaseGroup,"shaders","Shader features");
  pEVar1 = init::ExtGroup::operator<<(&local_20,"GL_OES_fragment_precision_high");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_OES_standard_derivatives");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_EXT_shader_texture_lod");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_EXT_frag_depth");
  init::ExtGroup::operator<<(pEVar1,"GL_EXT_separate_shader_objects");
  init()::ExtGroup::ExtGroup(deqp::gles2::TestCaseGroup__char_const__char_const__
            (&local_20,&this->super_TestCaseGroup,"shader_binary_formats","Shader binary formats");
  pEVar1 = init::ExtGroup::operator<<(&local_20,"GL_OES_get_program_binary");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_AMD_program_binary_Z400");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_IMG_shader_binary");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_IMG_program_binary");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_ARM_mali_shader_binary");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_VIV_shader_binary");
  init::ExtGroup::operator<<(pEVar1,"GL_DMP_shader_binary");
  init()::ExtGroup::ExtGroup(deqp::gles2::TestCaseGroup__char_const__char_const__
            (&local_20,&this->super_TestCaseGroup,"development","Development aids");
  pEVar1 = init::ExtGroup::operator<<(&local_20,"GL_EXT_debug_label");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_EXT_debug_marker");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_AMD_performance_monitor");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_QCOM_performance_monitor_global_mode");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_QCOM_extended_get");
  init::ExtGroup::operator<<(pEVar1,"GL_QCOM_extended_get2");
  init()::ExtGroup::ExtGroup(deqp::gles2::TestCaseGroup__char_const__char_const__
            (&local_20,&this->super_TestCaseGroup,"other","Other extensions");
  pEVar1 = init::ExtGroup::operator<<(&local_20,"GL_OES_draw_texture");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_OES_mapbuffer");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_OES_vertex_array_object");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_EXT_occlusion_query_boolean");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_EXT_robustness");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_EXT_discard_framebuffer");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_EXT_read_format_bgra");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_EXT_multi_draw_arrays");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_EXT_unpack_subimage");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_EXT_blend_minmax");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_IMG_read_format");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_NV_coverage_sample");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_NV_read_depth_stencil");
  pEVar1 = init::ExtGroup::operator<<(pEVar1,"GL_SUN_multi_draw_arrays");
  return (int)pEVar1;
}

Assistant:

void init (void)
	{
		struct ExtGroup
		{
			tcu::TestCaseGroup*		group;
			const glu::ContextInfo&	ctxInfo;

			ExtGroup (TestCaseGroup* parent, const char* name, const char* desc)
				: group		(DE_NULL)
				, ctxInfo	(parent->getContext().getContextInfo())
			{
				group = new tcu::TestCaseGroup(parent->getTestContext(), name, desc);
				parent->addChild(group);
			}

			ExtGroup& operator<< (const char* extName)
			{
				group->addChild(new ExtensionCase(group->getTestContext(), ctxInfo, extName, "", extName));
				return *this;
			}
		};

		// Uncompressed formats.
		ExtGroup(this, "uncompressed_texture_formats", "Uncompressed texture formats")
			<< "GL_OES_texture_float_linear"
			<< "GL_OES_texture_half_float_linear"
			<< "GL_OES_texture_float"
			<< "GL_OES_texture_half_float"
			<< "GL_OES_texture_npot"
			<< "GL_EXT_texture_format_BGRA8888"
			<< "GL_EXT_texture_rg"
			<< "GL_EXT_texture_type_2_10_10_10_REV"
			<< "GL_EXT_sRGB"
			<< "GL_APPLE_rgb_422"
			<< "GL_APPLE_texture_format_BGRA8888";

		// Compressed formats.
		ExtGroup(this, "compressed_texture_formats", "Compressed texture formats")
			<< "GL_OES_compressed_ETC1_RGB8_texture"
			<< "GL_OES_compressed_paletted_texture"
			<< "GL_EXT_texture_compression_dxt1"
			<< "GL_AMD_compressed_3DC_texture"
			<< "GL_AMD_compressed_ATC_texture"
			<< "GL_IMG_texture_compression_pvrtc"
			<< "GL_NV_texture_compression_s3tc_update";

		// Texture features.
		ExtGroup(this, "texture", "Texturing features")
			<< "GL_OES_texture_3D"
			<< "GL_OES_depth_texture"
			<< "GL_EXT_texture_filter_anisotropic"
			<< "GL_EXT_texture_lod_bias"
			<< "GL_EXT_shadow_samplers"
			<< "GL_EXT_texture_storage"
			<< "GL_NV_texture_npot_2D_mipmap"
			<< "GL_APPLE_texture_max_level";

		// FBO features
		ExtGroup(this, "fbo", "FBO features")
			<< "GL_OES_depth24"
			<< "GL_OES_depth32"
			<< "GL_OES_packed_depth_stencil"
			<< "GL_OES_fbo_render_mipmap"
			<< "GL_OES_rgb8_rgba8"
			<< "GL_OES_stencil1"
			<< "GL_OES_stencil4"
			<< "GL_OES_stencil8"
			<< "GL_EXT_color_buffer_half_float"
			<< "GL_EXT_multisampled_render_to_texture"
			<< "GL_IMG_multisampled_render_to_texture"
			<< "GL_ARM_rgba8"
			<< "GL_NV_depth_nonlinear"
			<< "GL_NV_draw_buffers"
			<< "GL_NV_fbo_color_attachments"
			<< "GL_NV_read_buffer"
			<< "GL_APPLE_framebuffer_multisample";

		// Vertex data formats.
		ExtGroup(this, "vertex_data_formats", "Vertex data formats")
			<< "GL_OES_element_index_uint"
			<< "GL_OES_vertex_half_float"
			<< "GL_OES_vertex_type_10_10_10_2";

		// Shader functionality.
		ExtGroup(this, "shaders", "Shader features")
			<< "GL_OES_fragment_precision_high"
			<< "GL_OES_standard_derivatives"
			<< "GL_EXT_shader_texture_lod"
			<< "GL_EXT_frag_depth"
			<< "GL_EXT_separate_shader_objects";

		// Shader binary formats.
		ExtGroup(this, "shader_binary_formats", "Shader binary formats")
			<< "GL_OES_get_program_binary"
			<< "GL_AMD_program_binary_Z400"
			<< "GL_IMG_shader_binary"
			<< "GL_IMG_program_binary"
			<< "GL_ARM_mali_shader_binary"
			<< "GL_VIV_shader_binary"
			<< "GL_DMP_shader_binary";

		// Development features.
		ExtGroup(this, "development", "Development aids")
			<< "GL_EXT_debug_label"
			<< "GL_EXT_debug_marker"
			<< "GL_AMD_performance_monitor"
			<< "GL_QCOM_performance_monitor_global_mode"
			<< "GL_QCOM_extended_get"
			<< "GL_QCOM_extended_get2";

		// Other extensions.
		ExtGroup(this, "other", "Other extensions")
			<< "GL_OES_draw_texture"
			<< "GL_OES_mapbuffer"
			<< "GL_OES_vertex_array_object"
			<< "GL_EXT_occlusion_query_boolean"
			<< "GL_EXT_robustness"
			<< "GL_EXT_discard_framebuffer"
			<< "GL_EXT_read_format_bgra"
			<< "GL_EXT_multi_draw_arrays"
			<< "GL_EXT_unpack_subimage"
			<< "GL_EXT_blend_minmax"
			<< "GL_IMG_read_format"
			<< "GL_NV_coverage_sample"
			<< "GL_NV_read_depth_stencil"
			<< "GL_SUN_multi_draw_arrays";
	}